

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

curl_off_t Curl_creader_client_length(Curl_easy *data)

{
  bool bVar1;
  curl_off_t local_28;
  Curl_creader *local_18;
  Curl_creader *r;
  Curl_easy *data_local;
  
  local_18 = (data->req).reader_stack;
  while( true ) {
    bVar1 = false;
    if (local_18 != (Curl_creader *)0x0) {
      bVar1 = local_18->phase != CURL_CR_CLIENT;
    }
    if (!bVar1) break;
    local_18 = local_18->next;
  }
  if (local_18 == (Curl_creader *)0x0) {
    local_28 = -1;
  }
  else {
    local_28 = (*local_18->crt->total_length)(data,local_18);
  }
  return local_28;
}

Assistant:

curl_off_t Curl_creader_client_length(struct Curl_easy *data)
{
  struct Curl_creader *r = data->req.reader_stack;
  while(r && r->phase != CURL_CR_CLIENT)
    r = r->next;
  return r ? r->crt->total_length(data, r) : -1;
}